

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

void __thiscall
dg::vr::RelationsAnalyzer::inferFromNonEquality
          (RelationsAnalyzer *this,VRLocation *join,VectorSet<const_llvm::Value_*> *froms,Shift s,
          Handle placeholder)

{
  bool bVar1;
  VRLocation *pVVar2;
  reference ppVVar3;
  Bucket *lt;
  Argument *pAVar4;
  reference pBVar5;
  int in_ECX;
  undefined1 uVar6;
  undefined8 in_RDX;
  long in_RSI;
  Type TVar7;
  Function *in_RDI;
  pair<const_llvm::Value_*,_bool> pVar8;
  Handle entryBorderPlaceholder;
  size_t id;
  HandlePtr thisBorderPlaceholder;
  BorderValue *borderVal;
  const_iterator __end6;
  const_iterator __begin6;
  vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_> *__range6;
  ValueRelations *entryRels;
  Function *func;
  Argument *arg;
  bool direct;
  V compared;
  ICmpInst *icmp;
  iterator __end3;
  iterator __begin3;
  vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *__range3;
  Handle initH;
  V from;
  const_iterator __end2;
  const_iterator __begin2;
  VectorSet<const_llvm::Value_*> *__range2;
  ValueRelations *predGraph;
  undefined4 in_stack_fffffffffffffea8;
  Type in_stack_fffffffffffffeac;
  ValueRelations *in_stack_fffffffffffffeb0;
  VRLocation *in_stack_fffffffffffffeb8;
  ValueRelations *in_stack_fffffffffffffec0;
  VRLocation *in_stack_fffffffffffffed0;
  __normal_iterator<const_dg::vr::BorderValue_*,_std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>_>
  local_108;
  vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_> *local_100;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_f8;
  ValueRelations *local_f0;
  undefined8 local_e8;
  Argument *local_e0;
  Handle in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  Type in_stack_ffffffffffffff34;
  undefined7 in_stack_ffffffffffffff41;
  undefined1 in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff51;
  undefined7 in_stack_ffffffffffffff58;
  byte in_stack_ffffffffffffff5f;
  ValueRelations *in_stack_ffffffffffffff60;
  int local_8c;
  __normal_iterator<const_llvm::ICmpInst_**,_std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>_>
  local_80;
  undefined1 local_78 [24];
  undefined1 *local_60;
  Handle local_58;
  Value *local_50;
  Value **local_48;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_40;
  undefined8 local_38;
  ValueRelations *local_30;
  int local_1c;
  undefined8 local_18;
  long local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pVVar2 = VRLocation::getTreePredecessor(in_stack_fffffffffffffed0);
  local_30 = &pVVar2->relations;
  local_38 = local_18;
  local_40._M_current =
       (Value **)
       VectorSet<const_llvm::Value_*>::begin
                 ((VectorSet<const_llvm::Value_*> *)
                  CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  local_48 = (Value **)
             VectorSet<const_llvm::Value_*>::end
                       ((VectorSet<const_llvm::Value_*> *)
                        CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                        *)in_stack_fffffffffffffeb0,
                       (__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    if (!bVar1) {
      return;
    }
    ppVVar3 = __gnu_cxx::
              __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
              ::operator*(&local_40);
    local_50 = *ppVVar3;
    local_58 = ValueRelations::getPointedTo<llvm::Value_const*>
                         (in_stack_fffffffffffffeb0,
                          (Value **)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    getEQICmp((RelationsAnalyzer *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
              (VRLocation *)CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50));
    local_60 = local_78;
    local_80._M_current =
         (ICmpInst **)
         std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::begin
                   ((vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)
                    CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::end
              ((vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_llvm::ICmpInst_**,_std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>_>
                               *)in_stack_fffffffffffffeb0,
                              (__normal_iterator<const_llvm::ICmpInst_**,_std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>_>
                               *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)),
          bVar1) {
      __gnu_cxx::
      __normal_iterator<const_llvm::ICmpInst_**,_std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>_>
      ::operator*(&local_80);
      VRCodeGraph::getVRLocation
                ((VRCodeGraph *)in_stack_fffffffffffffeb0,
                 (Instruction *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      pVar8 = getCompared(in_stack_ffffffffffffff60,
                          (ICmpInst *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                          (Value *)CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50));
      lt = (Bucket *)pVar8.first;
      uVar6 = pVar8.second;
      in_stack_ffffffffffffff50 = uVar6;
      std::tie<llvm::Value_const*,bool>
                ((Value **)in_stack_fffffffffffffeb8,(bool *)in_stack_fffffffffffffeb0);
      std::tuple<llvm::Value_const*&,bool&>::operator=
                ((tuple<const_llvm::Value_*&,_bool_&> *)in_stack_fffffffffffffec0,
                 (pair<const_llvm::Value_*,_bool> *)in_stack_fffffffffffffeb8);
      if (in_stack_ffffffffffffff60 != (ValueRelations *)0x0) {
        bVar1 = llvm::isa<llvm::Constant,llvm::Value_const*>((Value **)0x1d1592);
        if (!bVar1) {
          VRCodeGraph::getVRLocation
                    ((VRCodeGraph *)in_stack_fffffffffffffeb0,
                     (Instruction *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          pAVar4 = ValueRelations::getInstance<llvm::Argument>
                             ((ValueRelations *)in_stack_fffffffffffffeb8,
                              (V)in_stack_fffffffffffffeb0);
          if (pAVar4 == (Argument *)0x0) goto LAB_001d1958;
        }
        local_e0 = getArgument((ValueRelations *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               in_stack_ffffffffffffff28);
        if (local_e0 != (Argument *)0x0) {
          local_e8 = llvm::Instruction::getFunction();
          pVVar2 = VRCodeGraph::getEntryLocation
                             ((VRCodeGraph *)in_stack_fffffffffffffeb0,
                              (Function *)
                              CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          local_f0 = &pVVar2->relations;
          if ((in_stack_ffffffffffffff5f & 1) == 0) {
            bVar1 = StructureAnalyzer::hasBorderValues
                              ((StructureAnalyzer *)in_stack_fffffffffffffec0,
                               (Function *)in_stack_fffffffffffffeb8);
            if (bVar1) {
              local_100 = StructureAnalyzer::getBorderValuesFor
                                    ((StructureAnalyzer *)in_stack_fffffffffffffeb0,
                                     (Function *)
                                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
              local_108._M_current =
                   (BorderValue *)
                   std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>::begin
                             ((vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_> *)
                              CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
              std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>::end
                        ((vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_> *)
                         CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
              while (bVar1 = __gnu_cxx::operator!=
                                       ((__normal_iterator<const_dg::vr::BorderValue_*,_std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>_>
                                         *)in_stack_fffffffffffffeb0,
                                        (__normal_iterator<const_dg::vr::BorderValue_*,_std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>_>
                                         *)CONCAT44(in_stack_fffffffffffffeac,
                                                    in_stack_fffffffffffffea8)), bVar1) {
                pBVar5 = __gnu_cxx::
                         __normal_iterator<const_dg::vr::BorderValue_*,_std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>_>
                         ::operator*(&local_108);
                if ((pBVar5->from == local_e0) &&
                   ((ValueRelations *)pBVar5->stored == in_stack_ffffffffffffff60)) {
                  ValueRelations::getBorderH
                            (in_stack_fffffffffffffeb0,
                             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
                  ValueRelations::set<dg::vr::Bucket,dg::vr::Bucket>
                            ((ValueRelations *)CONCAT71(in_stack_ffffffffffffff41,uVar6),lt,
                             in_stack_ffffffffffffff34,in_stack_ffffffffffffff28);
                  local_8c = 1;
                  goto LAB_001d196a;
                }
                __gnu_cxx::
                __normal_iterator<const_dg::vr::BorderValue_*,_std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>_>
                ::operator++(&local_108);
              }
            }
            StructureAnalyzer::addBorderValue
                      ((StructureAnalyzer *)in_stack_fffffffffffffed0,in_RDI,
                       (Argument *)in_stack_fffffffffffffec0,(Value *)in_stack_fffffffffffffeb8);
            in_stack_fffffffffffffeb8 =
                 (VRLocation *)
                 ValueRelations::newBorderBucket
                           ((ValueRelations *)in_stack_fffffffffffffed0,(size_t)in_RDI);
            ValueRelations::set<dg::vr::Bucket,llvm::Value_const*>
                      ((ValueRelations *)CONCAT71(in_stack_ffffffffffffff41,uVar6),lt,
                       in_stack_ffffffffffffff34,(Value **)in_stack_ffffffffffffff28);
            TVar7 = SGE;
            if (local_1c == 0) {
              TVar7 = SLE;
            }
            in_stack_fffffffffffffeb0 = local_f0;
            in_stack_fffffffffffffed0 = in_stack_fffffffffffffeb8;
            dg::vr::Relations::inverted(TVar7);
            ValueRelations::set<dg::vr::Bucket,llvm::Argument_const*>
                      ((ValueRelations *)CONCAT71(in_stack_ffffffffffffff41,uVar6),lt,
                       in_stack_ffffffffffffff34,(Argument **)in_stack_ffffffffffffff28);
          }
          else {
            in_stack_fffffffffffffec0 = (ValueRelations *)(local_10 + 8);
            ValueRelations::getEqual(in_stack_fffffffffffffec0,(Handle)in_stack_fffffffffffffeb8);
            local_f8._M_current =
                 (Value **)
                 VectorSet<const_llvm::Value_*>::begin
                           ((VectorSet<const_llvm::Value_*> *)
                            CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
            __gnu_cxx::
            __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
            ::operator*(&local_f8);
            bVar1 = ValueRelations::are<llvm::Value_const*,llvm::Value_const*>
                              (in_stack_fffffffffffffec0,(Value **)in_stack_fffffffffffffeb8,
                               (Type)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                               (Value **)
                               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              StructureAnalyzer::addPrecondition
                        ((StructureAnalyzer *)in_stack_fffffffffffffec0,
                         (Function *)in_stack_fffffffffffffeb8,(Argument *)in_stack_fffffffffffffeb0
                         ,in_stack_fffffffffffffeac,(Value *)0x1d16db);
              ValueRelations::set<llvm::Argument_const*,llvm::Value_const*>
                        ((ValueRelations *)CONCAT71(in_stack_ffffffffffffff41,uVar6),(Argument **)lt
                         ,in_stack_ffffffffffffff34,(Value **)in_stack_ffffffffffffff28);
            }
            bVar1 = ValueRelations::are<llvm::Argument_const*,llvm::Value_const*>
                              (in_stack_fffffffffffffec0,(Argument **)in_stack_fffffffffffffeb8,
                               (Type)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                               (Value **)
                               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
            if (bVar1) {
              ValueRelations::set<dg::vr::Bucket,llvm::Value_const*>
                        ((ValueRelations *)CONCAT71(in_stack_ffffffffffffff41,uVar6),lt,
                         in_stack_ffffffffffffff34,(Value **)in_stack_ffffffffffffff28);
            }
            else {
              ValueRelations::set<dg::vr::Bucket,llvm::Value_const*>
                        ((ValueRelations *)CONCAT71(in_stack_ffffffffffffff41,uVar6),lt,
                         in_stack_ffffffffffffff34,(Value **)in_stack_ffffffffffffff28);
            }
          }
        }
      }
LAB_001d1958:
      __gnu_cxx::
      __normal_iterator<const_llvm::ICmpInst_**,_std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>_>
      ::operator++(&local_80);
    }
    local_8c = 4;
LAB_001d196a:
    std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::~vector
              ((vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)
               in_stack_fffffffffffffec0);
    if (local_8c == 1) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
    ::operator++(&local_40);
  } while( true );
}

Assistant:

void RelationsAnalyzer::inferFromNonEquality(VRLocation &join,
                                             const VectorSet<V> &froms, Shift s,
                                             Handle placeholder) {
    const ValueRelations &predGraph = join.getTreePredecessor().relations;
    for (V from : froms) {
        Handle initH = predGraph.getPointedTo(from);
        for (const auto *icmp : getEQICmp(join)) {
            V compared;
            bool direct;
            std::tie(compared, direct) = getCompared(
                    codeGraph.getVRLocation(icmp).relations, icmp, from);
            if (!compared ||
                (!llvm::isa<llvm::Constant>(compared) &&
                 !codeGraph.getVRLocation(icmp)
                          .relations.getInstance<llvm::Argument>(compared)))
                continue;

            const llvm::Argument *arg = getArgument(predGraph, initH);
            if (!arg)
                continue;

            const llvm::Function *func = icmp->getFunction();

            ValueRelations &entryRels =
                    codeGraph.getEntryLocation(*func).relations;
            if (direct) {
                if (!join.relations.are(*predGraph.getEqual(initH).begin(),
                                        s == Shift::INC ? Relations::SLE
                                                        : Relations::SGE,
                                        compared)) {
                    structure.addPrecondition(func, arg,
                                              s == Shift::INC ? Relations::SLE
                                                              : Relations::SGE,
                                              compared);
                    entryRels.set(arg,
                                  s == Shift::INC ? Relations::SLE
                                                  : Relations::SGE,
                                  compared);
                }

                if (join.relations.are(arg, Relations::NE, compared))
                    join.relations.set(placeholder,
                                       s == Shift::INC ? Relations::SLT
                                                       : Relations::SGT,
                                       compared);
                else
                    join.relations.set(placeholder,
                                       s == Shift::INC ? Relations::SLE
                                                       : Relations::SGE,
                                       compared);
            } else {
                if (structure.hasBorderValues(func)) {
                    for (const auto &borderVal :
                         structure.getBorderValuesFor(func)) {
                        if (borderVal.from == arg &&
                            borderVal.stored == compared) {
                            auto thisBorderPlaceholder =
                                    join.relations.getBorderH(borderVal.id);
                            assert(thisBorderPlaceholder);
                            join.relations.set(placeholder,
                                               s == Shift::INC ? Relations::SLE
                                                               : Relations::SGE,
                                               *thisBorderPlaceholder);
                            return;
                        }
                    }
                }

                auto id = structure.addBorderValue(func, arg, compared);
                Handle entryBorderPlaceholder = entryRels.newBorderBucket(id);
                entryRels.set(entryBorderPlaceholder, Relations::PT, compared);
                entryRels.set(entryBorderPlaceholder,
                              Relations::inverted(s == Shift::INC
                                                          ? Relations::SLE
                                                          : Relations::SGE),
                              arg);
            }
        }
    }
}